

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O0

REF_STATUS ref_dict_remove(REF_DICT ref_dict,REF_INT key)

{
  REF_STATUS local_24;
  REF_STATUS ref_private_macro_code_raise;
  REF_INT location;
  REF_INT i;
  REF_INT key_local;
  REF_DICT ref_dict_local;
  
  location = key;
  _i = ref_dict;
  ref_dict_local._4_4_ = ref_dict_location(ref_dict,key,&local_24);
  if (ref_dict_local._4_4_ == 0) {
    _i->n = _i->n + -1;
    for (ref_private_macro_code_raise = local_24; ref_private_macro_code_raise < _i->n;
        ref_private_macro_code_raise = ref_private_macro_code_raise + 1) {
      _i->key[ref_private_macro_code_raise] = _i->key[ref_private_macro_code_raise + 1];
    }
    for (ref_private_macro_code_raise = local_24; ref_private_macro_code_raise < _i->n;
        ref_private_macro_code_raise = ref_private_macro_code_raise + 1) {
      _i->value[ref_private_macro_code_raise] = _i->value[ref_private_macro_code_raise + 1];
    }
    ref_dict_local._4_4_ = 0;
  }
  return ref_dict_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_dict_remove(REF_DICT ref_dict, REF_INT key) {
  REF_INT i, location;

  RAISE(ref_dict_location(ref_dict, key, &location));

  ref_dict_n(ref_dict)--;

  for (i = location; i < ref_dict_n(ref_dict); i++) {
    ref_dict->key[i] = ref_dict->key[i + 1];
  }
  for (i = location; i < ref_dict_n(ref_dict); i++) {
    ref_dict->value[i] = ref_dict->value[i + 1];
  }

  return REF_SUCCESS;
}